

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

ExpEmit __thiscall FxConstant::Emit(FxConstant *this,VMFunctionBuilder *build)

{
  VMFunctionBuilder *this_00;
  int iVar1;
  ExpEmit local_40;
  ExpVal local_30;
  VM_ATAG tag;
  VMFunctionBuilder *pVStack_20;
  int regtype;
  VMFunctionBuilder *build_local;
  FxConstant *this_local;
  ExpEmit out;
  
  pVStack_20 = build;
  build_local = (VMFunctionBuilder *)this;
  ExpEmit::ExpEmit((ExpEmit *)((long)&this_local + 5));
  this_local._7_1_ = this_local._7_1_ & 0xfe | 1;
  local_30.field_1._4_4_ = (*(((this->value).Type)->super_DObject)._vptr_DObject[0x12])();
  this_00 = pVStack_20;
  this_local._6_1_ = (byte)local_30.field_1._4_4_;
  if (local_30.field_1._4_4_ == 0) {
    iVar1 = VMFunctionBuilder::GetConstantInt(pVStack_20,(this->value).field_1.Int);
    this_local._5_2_ = CONCAT11(this_local._6_1_,(char)iVar1);
  }
  else if (local_30.field_1._4_4_ == 1) {
    iVar1 = VMFunctionBuilder::GetConstantFloat(pVStack_20,(this->value).field_1.Float);
    this_local._5_2_ = CONCAT11(this_local._6_1_,(char)iVar1);
  }
  else if (local_30.field_1._4_4_ == 3) {
    local_30.field_1.Int._3_1_ = '\0';
    if ((this->value).Type == (PType *)TypeState) {
      local_30.field_1.Int._3_1_ = '\a';
    }
    else {
      iVar1 = (*(((this->value).Type)->super_DObject)._vptr_DObject[0x11])();
      if (iVar1 == 0x17) {
        local_30.field_1.Int._3_1_ = '\x01';
      }
    }
    iVar1 = VMFunctionBuilder::GetConstantAddress
                      (pVStack_20,(this->value).field_1.pointer,local_30.field_1.Int._3_1_);
    this_local._5_2_ = CONCAT11(this_local._6_1_,(char)iVar1);
  }
  else if (local_30.field_1._4_4_ == 2) {
    ExpVal::GetString(&local_30);
    iVar1 = VMFunctionBuilder::GetConstantString(this_00,(FString *)&local_30);
    this_local._5_2_ = CONCAT11(this_local._6_1_,(char)iVar1);
    FString::~FString((FString *)&local_30);
  }
  else {
    FScriptPosition::Message
              (&(this->super_FxExpression).ScriptPosition,2,"Cannot emit needed constant");
    this_local._5_2_ = (ushort)this_local._6_1_ << 8;
  }
  local_40._2_1_ = this_local._7_1_;
  local_40.RegNum = this_local._5_1_;
  local_40.RegType = this_local._6_1_;
  return local_40;
}

Assistant:

ExpEmit FxConstant::Emit(VMFunctionBuilder *build)
{
	ExpEmit out;

	out.Konst = true;
	int regtype = value.Type->GetRegType();
	out.RegType = regtype;
	if (regtype == REGT_INT)
	{
		out.RegNum = build->GetConstantInt(value.Int);
	}
	else if (regtype == REGT_FLOAT)
	{
		out.RegNum = build->GetConstantFloat(value.Float);
	}
	else if (regtype == REGT_POINTER)
	{
		VM_ATAG tag = ATAG_GENERIC;
		if (value.Type == TypeState)
		{
			tag = ATAG_STATE;
		}
		else if (value.Type->GetLoadOp() == OP_LO)
		{
			tag = ATAG_OBJECT;
		}
		out.RegNum = build->GetConstantAddress(value.pointer, tag);
	}
	else if (regtype == REGT_STRING)
	{
		out.RegNum = build->GetConstantString(value.GetString());
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Cannot emit needed constant");
		out.RegNum = 0;
	}
	return out;
}